

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::objectivec::ObjCClassDeclaration_abi_cxx11_
          (string *__return_storage_ptr__,objectivec *this,string_view class_name)

{
  string_view pc;
  AlphaNum *in_R8;
  AlphaNum local_c0;
  objectivec *local_90;
  size_t local_88;
  AlphaNum local_80;
  AlphaNum local_50;
  objectivec *local_20;
  string_view class_name_local;
  
  class_name_local._M_len = class_name._M_len;
  local_20 = this;
  class_name_local._M_str = (char *)__return_storage_ptr__;
  absl::lts_20250127::AlphaNum::AlphaNum(&local_50,"GPBObjCClassDeclaration(");
  local_90 = local_20;
  local_88 = class_name_local._M_len;
  pc._M_str = (char *)class_name_local._M_len;
  pc._M_len = (size_t)local_20;
  absl::lts_20250127::AlphaNum::AlphaNum(&local_80,pc);
  absl::lts_20250127::AlphaNum::AlphaNum(&local_c0,");");
  absl::lts_20250127::StrCat_abi_cxx11_
            (__return_storage_ptr__,(lts_20250127 *)&local_50,&local_80,&local_c0,in_R8);
  return __return_storage_ptr__;
}

Assistant:

std::string ObjCClassDeclaration(absl::string_view class_name) {
  return absl::StrCat("GPBObjCClassDeclaration(", class_name, ");");
}